

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O2

void server::UTFEncode(string *s)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d838,&local_49);
  std::__cxx11::string::string((string *)&local_48,"A",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d850,&local_49);
  std::__cxx11::string::string((string *)&local_48,"E",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d868,&local_49);
  std::__cxx11::string::string((string *)&local_48,"I",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d880,&local_49);
  std::__cxx11::string::string((string *)&local_48,"O",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d898,&local_49);
  std::__cxx11::string::string((string *)&local_48,"U",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d8b0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d8c8,&local_49);
  std::__cxx11::string::string((string *)&local_48,"e",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d8e0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"i",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d8f8,&local_49);
  std::__cxx11::string::string((string *)&local_48,"o",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d910,&local_49);
  std::__cxx11::string::string((string *)&local_48,"u",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d928,&local_49);
  std::__cxx11::string::string((string *)&local_48,"E",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d934,&local_49);
  std::__cxx11::string::string((string *)&local_48,"I",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d940,&local_49);
  std::__cxx11::string::string((string *)&local_48,"O",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d94c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"U",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d958,&local_49);
  std::__cxx11::string::string((string *)&local_48,"Y",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d970,&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d97c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"e",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d988,&local_49);
  std::__cxx11::string::string((string *)&local_48,"i",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d994,&local_49);
  std::__cxx11::string::string((string *)&local_48,"o",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9a0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"u",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9ac,&local_49);
  std::__cxx11::string::string((string *)&local_48,"y",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9c4,&local_49);
  std::__cxx11::string::string((string *)&local_48,"A",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9d0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"E",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9dc,&local_49);
  std::__cxx11::string::string((string *)&local_48,"I",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9e8,&local_49);
  std::__cxx11::string::string((string *)&local_48,"O",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4d9f4,&local_49);
  std::__cxx11::string::string((string *)&local_48,"U",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da00,&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da0c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"e",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da18,&local_49);
  std::__cxx11::string::string((string *)&local_48,"i",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da24,&local_49);
  std::__cxx11::string::string((string *)&local_48,"o",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da30,&local_49);
  std::__cxx11::string::string((string *)&local_48,"u",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da3c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"N",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da54,&local_49);
  std::__cxx11::string::string((string *)&local_48,"O",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da60,&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da6c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"n",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da84,&local_49);
  std::__cxx11::string::string((string *)&local_48,"o",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da90,&local_49);
  std::__cxx11::string::string((string *)&local_48,"A",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4da9c,&local_49);
  std::__cxx11::string::string((string *)&local_48,"E",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4daa8,&local_49);
  std::__cxx11::string::string((string *)&local_48,"I",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dab4,&local_49);
  std::__cxx11::string::string((string *)&local_48,"O",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dac0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"U",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dacc,&local_49);
  std::__cxx11::string::string((string *)&local_48,"Y",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dad8,&local_49);
  std::__cxx11::string::string((string *)&local_48,"a",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dae4,&local_49);
  std::__cxx11::string::string((string *)&local_48,"e",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4daf0,&local_49);
  std::__cxx11::string::string((string *)&local_48,"i",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4dafc,&local_49);
  std::__cxx11::string::string((string *)&local_48,"o",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4db08,&local_49);
  std::__cxx11::string::string((string *)&local_48,"u",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4db14,&local_49);
  std::__cxx11::string::string((string *)&local_48,"y",&local_4a);
  RString(s,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void UTFEncode(std::string& s) {
        RString(s, "À", "A"); RString(s, "È", "E"); RString(s, "Ì", "I");
        RString(s, "Ò", "O"); RString(s, "Ù", "U"); RString(s, "à", "a");
        RString(s, "è", "e"); RString(s, "ì", "i"); RString(s, "ò", "o");
        RString(s, "ù", "u"); RString(s, "É", "E"); RString(s, "Í", "I");
        RString(s, "Ó", "O"); RString(s, "Ú", "U"); RString(s, "Ý", "Y");
        RString(s, "á", "a"); RString(s, "é", "e"); RString(s, "í", "i");
        RString(s, "ó", "o"); RString(s, "ú", "u"); RString(s, "ý", "y");
        RString(s, "Â", "A"); RString(s, "Ê", "E"); RString(s, "Î", "I");
        RString(s, "Ô", "O"); RString(s, "Û", "U"); RString(s, "â", "a");
        RString(s, "ê", "e"); RString(s, "î", "i"); RString(s, "ô", "o");
        RString(s, "û", "u"); RString(s, "Ñ", "N"); RString(s, "Õ", "O");
        RString(s, "ã", "a"); RString(s, "ñ", "n"); RString(s, "õ", "o");
        RString(s, "Ä", "A"); RString(s, "Ë", "E"); RString(s, "Ï", "I");
        RString(s, "Ö", "O"); RString(s, "Ü", "U"); RString(s, "Ÿ", "Y");
        RString(s, "ä", "a"); RString(s, "ë", "e"); RString(s, "ï", "i");
        RString(s, "ö", "o"); RString(s, "ü", "u"); RString(s, "ÿ", "y");
    }